

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forces_and_moments.cpp
# Opt level: O1

double __thiscall InitShift::calculate(InitShift *this,double x,int degree)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if (0 < degree) {
    return 0.0;
  }
  dVar4 = 1.0;
  dVar5 = 1.0;
  if (degree != 0) {
    iVar2 = 1 - degree;
    dVar5 = 1.0;
    do {
      dVar5 = dVar5 * x;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  if (degree < -1) {
    iVar3 = 1;
    iVar2 = -degree;
    do {
      iVar3 = iVar3 * iVar2;
      bVar1 = 2 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar1);
    dVar4 = (double)iVar3;
  }
  return (this->force * dVar5) / dVar4;
}

Assistant:

double InitShift::calculate(double x, int degree) const
{
    // Added IJ as a force for easier counting
    return calculatePolinomAtPoint(x, force, -degree);
}